

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer ppTVar2;
  _Alloc_hider _Var3;
  testing *this_00;
  char *in_R8;
  string counts;
  string local_30;
  
  this_00 = (testing *)0x0;
  for (ppTVar2 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    this_00 = (testing *)(ulong)((int)this_00 + (uint)(*ppTVar2)->should_run_);
  }
  FormatCountableNoun_abi_cxx11_(&local_30,this_00,0x13c270,"tests",in_R8);
  ColoredPrintf(kGreen,"[----------] ");
  printf("%s from %s",local_30._M_dataplus._M_p,(test_case->name_)._M_dataplus._M_p);
  pbVar1 = (test_case->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     ((pbVar1->_M_dataplus)._M_p == (pointer)0x0)) {
    putchar(10);
  }
  else {
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var3._M_p = (pointer)0x0;
    }
    else {
      _Var3._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    printf(", where %s = %s\n","TypeParam",_Var3._M_p);
  }
  fflush(_stdout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(GTestColor::kGreen, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case.name());
  if (test_case.type_param() == nullptr) {
    printf("\n");
  } else {
    printf(", where %s = %s\n", kTypeParamLabel, test_case.type_param());
  }
  fflush(stdout);
}